

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsimplex_p.cpp
# Opt level: O1

int __thiscall QSimplex::findPivotColumn(QSimplex *this)

{
  double dVar1;
  int iVar2;
  ulong uVar4;
  double dVar5;
  ulong uVar3;
  
  uVar3 = 0xffffffff;
  iVar2 = -1;
  if (1 < this->columns) {
    dVar5 = 0.0;
    uVar4 = 0;
    do {
      dVar1 = this->matrix[uVar4];
      if (dVar1 < dVar5) {
        uVar3 = uVar4 & 0xffffffff;
      }
      iVar2 = (int)uVar3;
      if (dVar5 <= dVar1) {
        dVar1 = dVar5;
      }
      dVar5 = dVar1;
      uVar4 = uVar4 + 1;
    } while (this->columns - 1 != uVar4);
  }
  return iVar2;
}

Assistant:

int QSimplex::findPivotColumn()
{
    qreal min = 0;
    int minIndex = -1;

    for (int j = 0; j < columns-1; ++j) {
        if (valueAt(0, j) < min) {
            min = valueAt(0, j);
            minIndex = j;
        }
    }

    return minIndex;
}